

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-spoil.c
# Opt level: O1

errr init_spoil(int argc,char **argv)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  _Bool _Var6;
  uint uVar7;
  char *pcVar8;
  ang_file *paVar9;
  ang_file *f;
  int *piVar10;
  ulong uVar11;
  char **ppcVar12;
  ulong uVar13;
  bool bVar14;
  int iVar15;
  uint32_t uVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  char defname [1024];
  char *valend;
  char *local_860;
  uint32_t local_854;
  char *local_840;
  char local_838 [1024];
  char *local_438 [129];
  
  iVar1 = argc + -1;
  bVar4 = false;
  local_860 = (char *)0x0;
  bVar3 = false;
  local_854 = 0;
  bVar14 = false;
  iVar15 = 1;
  do {
    iVar18 = iVar15;
    if (iVar15 < argc) {
      pcVar8 = argv[iVar15];
      iVar18 = 1;
      bVar19 = true;
      if (*pcVar8 == '-') {
        cVar2 = pcVar8[1];
        if (cVar2 == 's') {
          if (pcVar8[2] != '\0') goto LAB_00125f5b;
          if (iVar15 < iVar1) {
            uVar13 = strtoul(argv[(long)iVar15 + 1],local_438,0x10);
            if (((*argv[(long)iVar15 + 1] == '\0') ||
                (_Var5 = contains_only_spaces(local_438[0]), !_Var5)) || (uVar13 >> 0x20 != 0)) {
              if (uVar13 >> 0x20 == 0) {
                printf("init-spoil: \'%s\' requires an integer argument, the randart seed\n");
              }
              else {
                puts("init-spoil: seed is too large");
              }
              bVar14 = true;
            }
            else {
              bVar4 = true;
              bVar3 = true;
              local_854 = (uint32_t)uVar13;
            }
LAB_001260a8:
            iVar18 = 2;
            goto LAB_001260ae;
          }
          pcVar8 = "init-spoil: \'%s\' requires an argument, the randart seed\n";
LAB_00126069:
          bVar19 = false;
          printf(pcVar8);
          iVar18 = 1;
          bVar14 = true;
        }
        else {
          if (cVar2 == 'r') {
            if (pcVar8[2] != '\0') goto LAB_00125f5b;
            if (iVar1 <= iVar15) {
              pcVar8 = "init-spoil: \'%s\' requires an argument, the name of a randart file\n";
              goto LAB_00126069;
            }
            local_860 = argv[(long)iVar15 + 1];
            bVar4 = true;
            iVar18 = 2;
          }
          else {
            if ((cVar2 != 'p') || (pcVar8[2] != '\0')) {
LAB_00125f5b:
              uVar13 = 0xffffffffffffffff;
              ppcVar12 = &opts[0].path;
              do {
                if ((cVar2 == ((anon_struct_32_4_a213e033 *)(ppcVar12 + -3))->letter) &&
                   (pcVar8[2] == '\0')) {
                  if (iVar15 < iVar1) {
                    *(_Bool *)(ppcVar12 + -1) = true;
                    *ppcVar12 = argv[(long)iVar15 + 1];
                    goto LAB_001260a8;
                  }
                  pcVar8 = "init-spoil: \'%s\' requires an argument, the name of the spoiler file\n"
                  ;
                  goto LAB_00126069;
                }
                uVar13 = uVar13 + 1;
                ppcVar12 = ppcVar12 + 4;
                bVar19 = 2 < uVar13;
              } while (uVar13 != 3);
              goto LAB_001260b0;
            }
            bVar4 = true;
            local_860 = (char *)0x0;
            iVar18 = 1;
          }
LAB_001260ae:
          bVar19 = false;
        }
      }
LAB_001260b0:
      if (bVar19) {
        printf("init-spoil: bad argument \'%s\'\n");
        bVar14 = true;
      }
      iVar18 = iVar18 + iVar15;
    }
    bVar19 = iVar15 < argc;
    iVar15 = iVar18;
  } while (bVar19);
  if (bVar14) {
    return 1;
  }
  init_angband();
  if (bVar4) {
    if ((local_860 != (char *)0x0) || (bVar3)) {
      _Var5 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
      if (_Var5) {
        memset(local_838,0,0x400);
        deactivate_randart_file();
        pcVar8 = option_name(0x1e);
        option_set(pcVar8,1);
        if (local_860 == (char *)0x0) {
          seed_randart = local_854;
          do_randart(local_854,true);
LAB_001263b9:
          bVar14 = true;
        }
        else {
          path_build(local_838,0x400,ANGBAND_DIR_USER,"randart.txt");
          paVar9 = file_open(local_860,MODE_READ,0xffffffff);
          if (paVar9 != (ang_file *)0x0) {
            f = file_open(local_838,MODE_WRITE,FTYPE_TEXT);
            if (f == (ang_file *)0x0) {
              file_close(paVar9);
            }
            else {
              bVar14 = true;
              do {
                uVar7 = file_read(paVar9,(char *)local_438,0x400);
                _Var5 = uVar7 == 0;
                if ((int)uVar7 < 1) {
                  _Var6 = false;
                }
                else {
                  _Var5 = file_write(f,(char *)local_438,(ulong)uVar7);
                  _Var6 = _Var5;
                }
                if (_Var5 == false) {
                  bVar14 = false;
                }
              } while (_Var6 != false);
              _Var5 = file_close(f);
              _Var6 = file_close(paVar9);
              if (((_Var6) && (_Var5)) && (bVar14)) {
                paVar9 = file_open(local_860,MODE_READ,0xffffffff);
                if (paVar9 == (ang_file *)0x0) {
                  seed_randart = 0;
                }
                else {
                  _Var5 = file_getl(paVar9,(char *)local_438,0x100);
                  uVar16 = 0;
                  if ((_Var5) &&
                     (pcVar8 = my_stristr((char *)local_438,"seed "), pcVar8 != (char *)0x0)) {
                    piVar10 = __errno_location();
                    *piVar10 = 0;
                    uVar11 = strtoul(pcVar8 + 5,&local_840,0x10);
                    uVar13 = 0;
                    if (uVar11 < 0x100000000) {
                      uVar13 = uVar11;
                    }
                    uVar16 = (uint32_t)uVar13;
                    if (local_840 == pcVar8 + 5) {
                      uVar16 = 0;
                    }
                  }
                  file_close(paVar9);
                  seed_randart = uVar16;
                }
                goto LAB_001263b9;
              }
            }
          }
          bVar14 = false;
          printf("init-spoil: could not copy randart file to \'%s\'.\n",local_838);
        }
        if (bVar14) {
          cleanup_parser(&artifact_parser);
          run_parser(&randart_parser);
          if (local_860 == (char *)0x0) {
            deactivate_randart_file();
          }
          else {
            file_delete(local_838);
          }
          if (bVar14) {
LAB_001263f9:
            flavor_set_all_aware();
            lVar17 = 0;
            do {
              if ((&opts[0].enabled)[lVar17] == true) {
                (**(code **)((long)&opts[0].func + lVar17))();
              }
              lVar17 = lVar17 + 0x20;
            } while (lVar17 != 0x80);
            cleanup_angband();
            exit(0);
          }
        }
        goto LAB_001262e9;
      }
      goto LAB_001262dd;
    }
    safe_setuid_grab();
    _Var5 = file_exists(savefile);
    safe_setuid_drop();
    if (_Var5) {
      _Var5 = savefile_load(savefile,false);
      deactivate_randart_file();
      if (_Var5) goto LAB_001263f9;
      pcVar8 = 
      "init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', failed to load.\n"
      ;
LAB_00126370:
      printf(pcVar8,savefile);
      goto LAB_001262e9;
    }
    if (savefile[0] != '\0') {
      pcVar8 = 
      "init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', does not exist.\n"
      ;
      goto LAB_00126370;
    }
    pcVar8 = 
    "init-spoil: using artifacts associated with a savefile, but main did not set the savefile.";
  }
  else {
    _Var5 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
    if (_Var5) goto LAB_001263f9;
LAB_001262dd:
    pcVar8 = "init-spoil: could not initialize player.";
  }
  puts(pcVar8);
LAB_001262e9:
  cleanup_angband();
  return 1;
}

Assistant:

errr init_spoil(int argc, char *argv[]) {
	/* Skip over argv[0] */
	int i = 1;
	int result = 0;
	bool load_randart = false;
	const char *randart_name = NULL;
	bool have_specified_seed = false;
	uint32_t specified_seed = 0;

	/* Parse the arguments. */
	while (1) {
		bool badarg = false;
		int increment = 1;

		if (i >= argc) {
			break;
		}

		if (argv[i][0] == '-') {
			/* Try to match with a known option. */
			if (argv[i][1] == 'p' && argv[i][2] == '\0') {
				load_randart = true;
				randart_name = NULL;
			} else if (argv[i][1] == 'r' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					load_randart = true;
					/* Record the name; don't parse it. */
					randart_name = argv[i + 1];
					++increment;
				} else {
					printf("init-spoil: '%s' requires an argument, the name of a randart file\n", argv[i]);
					result = 1;
				}
			} else if (argv[i][1] == 's' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					char *valend;
					unsigned long val;

					val = strtoul(argv[i + 1], &valend, 16);
					++increment;
					if (argv[i + 1][0] != '\0'
							&& contains_only_spaces(valend)
							&& val <= 0xFFFFFFFFul) {
						load_randart = true;
						have_specified_seed = true;
						specified_seed = val;
					} else if (val > 0xFFFFFFFFul) {
						printf("init-spoil: seed is too large\n");
						result = 1;
					} else {
						printf("init-spoil: '%s' requires an integer argument, the randart seed\n",
							argv[i]);
						result = 1;
					}
				} else {
					printf("init-spoil: '%s' requires an argument, the randart seed\n", argv[i]);
					result = 1;
				}
			} else {
				int j = 0;

				while (1) {
					if (j >= (int)N_ELEMENTS(opts)) {
						badarg = true;
						break;
					}

					if (argv[i][1] == opts[j].letter &&
							argv[i][2] == '\0') {
						if (i < argc - 1) {
							opts[j].enabled = true;
							/*
							 * Record the filename
							 * and skip parsing
							 * of it.
							 */
							opts[j].path =
								argv[i + 1];
							++increment;
						} else {
							printf("init-spoil: '%s' requires an argument, the name of the spoiler file\n", argv[i]);
							result = 1;
						}
						break;
					}

					++j;
				}
			}
		} else {
			badarg = true;
		}

		if (badarg) {
			printf("init-spoil: bad argument '%s'\n", argv[i]);
			result = 1;
		}

		i += increment;
	}

	if (result != 0) return result;

	/* Generate the spoilers. */
	init_angband();

	if (load_randart) {
		if (randart_name || have_specified_seed) {
			if (player_make_simple(NULL, NULL, "Spoiler")) {
				char defname[1024] = "";

				deactivate_randart_file();
				option_set(option_name(OPT_birth_randarts),
					true);

				if (randart_name) {
					path_build(defname, sizeof(defname),
						ANGBAND_DIR_USER,
						"randart.txt");
					/*
					 * Copy rather than move in case the
					 * file supplied is read-only.
					 */
					if (copy_file(randart_name, defname,
							FTYPE_TEXT)) {
						seed_randart = parse_seed(randart_name);
					} else {
						printf("init-spoil: could not copy randart file to '%s'.\n", defname);
						result = 1;
					}
				} else {
					seed_randart = specified_seed;
					do_randart(seed_randart, true);
				}

				if (result == 0) {
					cleanup_parser(&artifact_parser);
					run_parser(&randart_parser);
					if (randart_name) {
						file_delete(defname);
					} else {
						deactivate_randart_file();
					}
				}
			} else {
				printf("init-spoil: could not initialize player.\n");
				result = 1;
			}
		} else {
			bool exists;

			safe_setuid_grab();
			exists = file_exists(savefile);
			safe_setuid_drop();
			if (exists) {
				bool loaded_save =
					savefile_load(savefile, false);

				deactivate_randart_file();
				if (!loaded_save) {
					printf("init-spoil: using artifacts "
						"associated with a savefile, "
						"but the savefile set by "
						"main, '%s', failed to load.\n",
						savefile);
					result = 1;
				}
			} else if (savefile[0]) {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but the savefile set "
					"by main, '%s', does not exist.\n",
					savefile);
				result = 1;
			} else {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but main did not set "
					"the savefile.\n");
				result = 1;
			}
		}
	} else if (!player_make_simple(NULL, NULL, "Spoiler")) {
		printf("init-spoil: could not initialize player.\n");
		result = 1;
	}

	if (result == 0) {
		flavor_set_all_aware();
		for (i = 0; i < (int)N_ELEMENTS(opts); ++i) {
			if (!opts[i].enabled) continue;
			(*(opts[i].func))(opts[i].path);
		}
	}

	cleanup_angband();

	if (result == 0) {
		exit(0);
	}

	return result;
}